

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void mjs::throw_runtime_error(string_view *s,char *file,int line)

{
  ostream *poVar1;
  runtime_error *this;
  string asStack_1b8 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  poVar1 = std::operator<<(poVar1,": ");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,s->_M_str,s->_M_len);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_1b8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void throw_runtime_error(const std::string_view& s, const char* file, int line) {
    std::ostringstream oss;
    oss << file << ":" << line << ": " << s;
    throw std::runtime_error(oss.str());
}